

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O2

int __thiscall jrtplib::RTCPCompoundPacketBuilder::EndBuild(RTCPCompoundPacketBuilder *this)

{
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  *plVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  RTPMemoryManager *mgr;
  RTCPCompoundPacketBuilder *pRVar5;
  ushort uVar6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  RTCPPacket *this_00;
  long lVar10;
  RTCPSDESPacket *this_01;
  RTCPAPPPacket *this_02;
  RTCPBYEPacket *this_03;
  long lVar11;
  bool bVar12;
  _Self __tmp;
  _List_node_base *p_Var13;
  _List_node_base *p_Var14;
  byte bVar15;
  _List_node_base *p_Var16;
  byte *data;
  ulong uVar17;
  long lVar18;
  RTCPPacket *p;
  RTCPCompoundPacketBuilder *local_68;
  list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_> *local_60;
  _List_node_base *local_58;
  _List_node_base *local_50;
  byte *local_48;
  size_t local_40;
  byte *local_38;
  
  if (this->arebuilding == true) {
    if ((this->report).headerlength == 0) {
      iVar7 = -0x29;
    }
    else {
      sVar3 = this->byesize;
      sVar4 = this->appsize;
      sVar8 = Report::NeededBytes(&this->report);
      sVar9 = SDES::NeededBytes(&this->sdes);
      local_40 = sVar9 + sVar8 + sVar3 + sVar4;
      if (this->external == false) {
        data = (byte *)operator_new__(local_40,(this->super_RTCPCompoundPacket).
                                               super_RTPMemoryObject.mgr,6);
        if (data == (byte *)0x0) {
          return -1;
        }
      }
      else {
        data = this->buffer;
      }
      plVar1 = &(this->report).reportblocks;
      p_Var13 = (this->report).reportblocks.
                super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      local_60 = &(this->super_RTCPCompoundPacket).rtcppacklist;
      bVar12 = true;
      local_68 = this;
      local_48 = data;
      do {
        pRVar5 = local_68;
        *data = *data & 0x1f | 0x80;
        if ((bVar12) && ((local_68->report).isSR == true)) {
          data[1] = 200;
          memcpy(data + 4,(local_68->report).headerdata,(local_68->report).headerlength);
          uVar17 = (pRVar5->report).headerlength + 4;
        }
        else {
          data[1] = 0xc9;
          *(undefined4 *)(data + 4) = *(undefined4 *)(local_68->report).headerdata;
          uVar17 = 8;
        }
        for (bVar15 = 0; (p_Var13 != (_List_node_base *)plVar1 && (bVar15 < 0x1f));
            bVar15 = bVar15 + 1) {
          memcpy(data + uVar17,p_Var13[1]._M_next,(size_t)p_Var13[1]._M_prev);
          uVar17 = (long)&(p_Var13[1]._M_prev)->_M_next + uVar17;
          p_Var13 = p_Var13->_M_next;
        }
        uVar6 = (short)(uVar17 >> 2) - 1;
        *(ushort *)(data + 2) = uVar6 * 0x100 | uVar6 >> 8;
        *data = (*data & 0xe0) + bVar15;
        mgr = (local_68->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr;
        if (data[1] == 200) {
          this_00 = (RTCPPacket *)operator_new(0x20,mgr,0x15);
          RTCPSRPacket::RTCPSRPacket((RTCPSRPacket *)this_00,data,uVar17);
        }
        else {
          this_00 = (RTCPPacket *)operator_new(0x20,mgr,0x13);
          RTCPRRPacket::RTCPRRPacket((RTCPRRPacket *)this_00,data,uVar17);
        }
        p = this_00;
        std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::push_back
                  (local_60,&p);
        data = data + uVar17;
        bVar12 = false;
      } while (p_Var13 != (_List_node_base *)plVar1);
      local_58 = (_List_node_base *)&(local_68->sdes).sdessources;
      p_Var13 = (local_68->sdes).sdessources.
                super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var13 != local_58) {
        do {
          *data = *data & 0x1f | 0x80;
          local_38 = data + 1;
          data[1] = 0xca;
          uVar17 = 4;
          for (bVar15 = 0; (p_Var13 != local_58 && (bVar15 < 0x1f)); bVar15 = bVar15 + 1) {
            p_Var14 = p_Var13[1]._M_next;
            uVar2 = *(uint *)&p_Var14[1]._M_next;
            *(uint *)(data + uVar17) =
                 uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
            lVar18 = uVar17 + 4;
            p_Var16 = (_List_node_base *)((long)(p_Var14 + 1) + 8);
            p_Var14 = p_Var16;
            local_50 = p_Var13;
            while( true ) {
              p_Var14 = p_Var14->_M_next;
              if (p_Var14 == p_Var16) break;
              memcpy(data + lVar18,p_Var14[1]._M_next,
                     (size_t)*(_List_node_base **)((long)(p_Var14 + 1) + 8));
              lVar18 = (long)&(*(_List_node_base **)((long)(p_Var14 + 1) + 8))->_M_next + lVar18;
            }
            data[lVar18] = 0;
            uVar17 = lVar18 + 1;
            if ((uVar17 & 3) != 0) {
              lVar10 = 4 - (uVar17 & 3);
              for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 1) {
                local_38[lVar11 + lVar18] = 0;
              }
              uVar17 = uVar17 + lVar10;
            }
            p_Var13 = local_50->_M_next;
          }
          *data = *data & 0xe0 | bVar15 & 0x1f;
          uVar6 = (short)(uVar17 >> 2) - 1;
          *(ushort *)(data + 2) = uVar6 * 0x100 | uVar6 >> 8;
          this_01 = (RTCPSDESPacket *)
                    operator_new(0x38,(local_68->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr
                                 ,0x14);
          RTCPSDESPacket::RTCPSDESPacket(this_01,data,uVar17);
          p = (RTCPPacket *)this_01;
          std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::
          push_back(local_60,&p);
          data = data + uVar17;
        } while (p_Var13 != local_58);
      }
      plVar1 = &local_68->apppackets;
      p_Var13 = (_List_node_base *)plVar1;
      while (pRVar5 = local_68,
            p_Var13 = (((_List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
                         *)&p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var13 != (_List_node_base *)plVar1) {
        memcpy(data,p_Var13[1]._M_next,(size_t)p_Var13[1]._M_prev);
        this_02 = (RTCPAPPPacket *)
                  operator_new(0x28,(pRVar5->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr,0xf
                              );
        RTCPAPPPacket::RTCPAPPPacket(this_02,data,(size_t)p_Var13[1]._M_prev);
        p = (RTCPPacket *)this_02;
        std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::push_back
                  (local_60,&p);
        data = data + (long)p_Var13[1]._M_prev;
      }
      plVar1 = &local_68->byepackets;
      p_Var13 = (_List_node_base *)plVar1;
      while (pRVar5 = local_68,
            p_Var13 = (((_List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
                         *)&p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var13 != (_List_node_base *)plVar1) {
        memcpy(data,p_Var13[1]._M_next,(size_t)p_Var13[1]._M_prev);
        this_03 = (RTCPBYEPacket *)
                  operator_new(0x28,(pRVar5->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr,
                               0x10);
        RTCPBYEPacket::RTCPBYEPacket(this_03,data,(size_t)p_Var13[1]._M_prev);
        p = (RTCPPacket *)this_03;
        std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::push_back
                  (local_60,&p);
        data = data + (long)p_Var13[1]._M_prev;
      }
      (local_68->super_RTCPCompoundPacket).compoundpacket = local_48;
      (local_68->super_RTCPCompoundPacket).compoundpacketlength = local_40;
      local_68->arebuilding = false;
      ClearBuildBuffers(local_68);
      iVar7 = 0;
    }
  }
  else {
    iVar7 = -0x2a;
  }
  return iVar7;
}

Assistant:

int RTCPCompoundPacketBuilder::EndBuild()
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;
	if (report.headerlength == 0)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOREPORTPRESENT;
	
	uint8_t *buf;
	size_t len;
	
#ifndef RTP_SUPPORT_RTCPUNKNOWN
	len = appsize+byesize+report.NeededBytes()+sdes.NeededBytes();
#else
	len = appsize+unknownsize+byesize+report.NeededBytes()+sdes.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	
	if (!external)
	{
		buf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTCPCOMPOUNDPACKET) uint8_t[len];
		if (buf == 0)
			return ERR_RTP_OUTOFMEM;
	}
	else
		buf = buffer;
	
	uint8_t *curbuf = buf;
	RTCPPacket *p;

	// first, we'll add all report info
	
	{
		bool firstpacket = true;
		bool done = false;
		std::list<Buffer>::const_iterator it = report.reportblocks.begin();
		do
		{
			RTCPCommonHeader *hdr = (RTCPCommonHeader *)curbuf;
			size_t offset;
			
			hdr->version = 2;
			hdr->padding = 0;

			if (firstpacket && report.isSR)
			{
				hdr->packettype = RTP_RTCPTYPE_SR;
				memcpy((curbuf+sizeof(RTCPCommonHeader)),report.headerdata,report.headerlength);
				offset = sizeof(RTCPCommonHeader)+report.headerlength;
			}
			else
			{
				hdr->packettype = RTP_RTCPTYPE_RR;
				memcpy((curbuf+sizeof(RTCPCommonHeader)),report.headerdata,sizeof(uint32_t));
				offset = sizeof(RTCPCommonHeader)+sizeof(uint32_t);
			}
			firstpacket = false;
			
			uint8_t count = 0;

			while (it != report.reportblocks.end() && count < 31)
			{
				memcpy(curbuf+offset,(*it).packetdata,(*it).packetlength);
				offset += (*it).packetlength;
				count++;
				it++;
			}

			size_t numwords = offset/sizeof(uint32_t);

			hdr->length = htons((uint16_t)(numwords-1));
			hdr->count = count;

			// add entry in parent's list
			if (hdr->packettype == RTP_RTCPTYPE_SR)
				p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPSRPACKET) RTCPSRPacket(curbuf,offset);
			else
				p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPRRPACKET) RTCPRRPacket(curbuf,offset);
			if (p == 0)
			{
				if (!external)
					RTPDeleteByteArray(buf,GetMemoryManager());
				ClearPacketList();
				return ERR_RTP_OUTOFMEM;
			}
			rtcppacklist.push_back(p);

			curbuf += offset;
			if (it == report.reportblocks.end())
				done = true;
		} while (!done);
	}
		
	// then, we'll add the sdes info

	if (!sdes.sdessources.empty())
	{
		bool done = false;
		std::list<SDESSource *>::const_iterator sourceit = sdes.sdessources.begin();
		
		do
		{
			RTCPCommonHeader *hdr = (RTCPCommonHeader *)curbuf;
			size_t offset = sizeof(RTCPCommonHeader);
			
			hdr->version = 2;
			hdr->padding = 0;
			hdr->packettype = RTP_RTCPTYPE_SDES;

			uint8_t sourcecount = 0;
			
			while (sourceit != sdes.sdessources.end() && sourcecount < 31)
			{
				uint32_t *ssrc = (uint32_t *)(curbuf+offset);
				*ssrc = htonl((*sourceit)->ssrc);
				offset += sizeof(uint32_t);
				
				std::list<Buffer>::const_iterator itemit,itemend;

				itemit = (*sourceit)->items.begin();
				itemend = (*sourceit)->items.end();
				while (itemit != itemend)
				{
					memcpy(curbuf+offset,(*itemit).packetdata,(*itemit).packetlength);
					offset += (*itemit).packetlength;
					itemit++;
				}

				curbuf[offset] = 0; // end of item list;
				offset++;

				size_t r = offset&0x03;
				if (r != 0) // align to 32 bit boundary
				{
					size_t num = 4-r;
					size_t i;

					for (i = 0 ; i < num ; i++)
						curbuf[offset+i] = 0;
					offset += num;
				}
				
				sourceit++;
				sourcecount++;
			}

			size_t numwords = offset/4;
			
			hdr->count = sourcecount;
			hdr->length = htons((uint16_t)(numwords-1));

			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPSDESPACKET) RTCPSDESPacket(curbuf,offset);
			if (p == 0)
			{
				if (!external)
					RTPDeleteByteArray(buf,GetMemoryManager());
				ClearPacketList();
				return ERR_RTP_OUTOFMEM;
			}
			rtcppacklist.push_back(p);
			
			curbuf += offset;
			if (sourceit == sdes.sdessources.end())
				done = true;
		} while (!done);
	}
	
	// adding the app data
	
	{
		std::list<Buffer>::const_iterator it;

		for (it = apppackets.begin() ; it != apppackets.end() ; it++)
		{
			memcpy(curbuf,(*it).packetdata,(*it).packetlength);
			
			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPAPPPACKET) RTCPAPPPacket(curbuf,(*it).packetlength);
			if (p == 0)
			{
				if (!external)
					RTPDeleteByteArray(buf,GetMemoryManager());
				ClearPacketList();
				return ERR_RTP_OUTOFMEM;
			}
			rtcppacklist.push_back(p);
	
			curbuf += (*it).packetlength;
		}
	}

#ifdef RTP_SUPPORT_RTCPUNKNOWN

	// adding the unknown data
	
	{
		std::list<Buffer>::const_iterator it;

		for (it = unknownpackets.begin() ; it != unknownpackets.end() ; it++)
		{
			memcpy(curbuf,(*it).packetdata,(*it).packetlength);
			
			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPUNKNOWNPACKET) RTCPUnknownPacket(curbuf,(*it).packetlength);
			if (p == 0)
			{
				if (!external)
					RTPDeleteByteArray(buf,GetMemoryManager());
				ClearPacketList();
				return ERR_RTP_OUTOFMEM;
			}
			rtcppacklist.push_back(p);
	
			curbuf += (*it).packetlength;
		}
	}

#endif // RTP_SUPPORT_RTCPUNKNOWN 

	// adding bye packets
	
	{
		std::list<Buffer>::const_iterator it;

		for (it = byepackets.begin() ; it != byepackets.end() ; it++)
		{
			memcpy(curbuf,(*it).packetdata,(*it).packetlength);
			
			p = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPBYEPACKET) RTCPBYEPacket(curbuf,(*it).packetlength);
			if (p == 0)
			{
				if (!external)
					RTPDeleteByteArray(buf,GetMemoryManager());
				ClearPacketList();
				return ERR_RTP_OUTOFMEM;
			}
			rtcppacklist.push_back(p);
	
			curbuf += (*it).packetlength;
		}
	}
	
	compoundpacket = buf;
	compoundpacketlength = len;
	arebuilding = false;
	ClearBuildBuffers();
	return 0;
}